

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O2

nameType nameDeclaration(string *name)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  nameType nVar4;
  allocator<char> local_141;
  string local_140;
  string local_120;
  string local_100;
  VariableObject obj;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&BuiltInFunctions_abi_cxx11_._M_t,name);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &BuiltInFunctions_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&local_100,name);
    bVar1 = ScopeManager::find(&scopeManager,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_120,name);
      ScopeManager::get(&obj,&scopeManager,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Function",&local_141)
      ;
      bVar1 = VariableObject::containType(&obj,&local_140);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_140);
        nVar4 = DeclaredFunction;
      }
      else {
        bVar1 = std::operator==(&obj.item.type,"Function");
        std::__cxx11::string::~string((string *)&local_140);
        nVar4 = (nameType)bVar1;
      }
      VariableObject::~VariableObject(&obj);
    }
    else {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassObject>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassObject>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassObject>_>_>
              ::find(&Classes_abi_cxx11_._M_t,name);
      if ((_Rb_tree_header *)iVar3._M_node == &Classes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
         ) {
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&BuiltInClasses_abi_cxx11_._M_t,name);
        nVar4 = (_Rb_tree_header *)iVar2._M_node ==
                &BuiltInClasses_abi_cxx11_._M_t._M_impl.super__Rb_tree_header | DeclaredClass;
      }
      else {
        nVar4 = DeclaredClass;
      }
    }
  }
  else {
    nVar4 = DeclaredFunction;
  }
  return nVar4;
}

Assistant:

nameType nameDeclaration(string name) {
	if (BuiltInFunctions.find(name) != BuiltInFunctions.end()) {
		return DeclaredFunction;
	}
	if (scopeManager.find(name)) {
		VariableObject obj = scopeManager.get(name);
		if (obj.containType("Function") or obj.item.type == "Function") {
			return DeclaredFunction;
		}
		return DeclaredVariable;
	}
	if (Classes.find(name) != Classes.end() or BuiltInClasses.find(name) != BuiltInClasses.end()) {
		return DeclaredClass;
	}
	return Undeclared;
}